

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O1

int lua_sethook(lua_State *L,lua_Hook func,int mask,int count)

{
  byte *pbVar1;
  byte bVar2;
  global_State *g;
  lua_Hook p_Var3;
  
  g = (global_State *)(ulong)(L->glref).ptr32;
  bVar2 = (byte)(mask & 0xfU);
  p_Var3 = (lua_Hook)0x0;
  if ((mask & 0xfU) != 0) {
    p_Var3 = func;
  }
  g->hookf = p_Var3;
  g->hookcstart = count;
  g->hookcount = count;
  if (func == (lua_Hook)0x0) {
    bVar2 = 0;
  }
  g->hookmask = bVar2 | g->hookmask & 0xf0;
  pbVar1 = (byte *)((long)&g[1].gc.tabnum + 4);
  *pbVar1 = *pbVar1 & 0xef;
  lj_dispatch_update(g);
  return 1;
}

Assistant:

LUA_API int lua_sethook(lua_State *L, lua_Hook func, int mask, int count)
{
  global_State *g = G(L);
  mask &= HOOK_EVENTMASK;
  if (func == NULL || mask == 0) { mask = 0; func = NULL; }  /* Consistency. */
  g->hookf = func;
  g->hookcount = g->hookcstart = (int32_t)count;
  g->hookmask = (uint8_t)((g->hookmask & ~HOOK_EVENTMASK) | mask);
  lj_trace_abort(g);  /* Abort recording on any hook change. */
  lj_dispatch_update(g);
  return 1;
}